

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.cpp
# Opt level: O0

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>_>::TPZGeoElMapped
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>_> *this,TPZGeoMesh *destmesh,
          TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>_> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdIdx,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElIdx)

{
  TPZFNMatrix<6,_double> *in_RCX;
  TPZRegisterClassId *in_RDI;
  TPZFNMatrix<6,_double> *in_R8;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *in_stack_00000218
  ;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *in_stack_00000220
  ;
  TPZGeoElRefPattern<pzgeom::TPZGeoTriangle> *in_stack_00000228;
  TPZGeoMesh *in_stack_00000230;
  void **in_stack_00000238;
  TPZGeoElRefPattern<pzgeom::TPZGeoTriangle> *in_stack_00000240;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>>>
            (in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024c6a20);
  TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::TPZGeoElRefPattern
            (in_stack_00000240,in_stack_00000238,in_stack_00000230,in_stack_00000228,
             in_stack_00000220,in_stack_00000218);
  *(undefined ***)in_RDI = &PTR__TPZGeoElMapped_024c66d8;
  *(undefined ***)in_RDI = &PTR__TPZGeoElMapped_024c66d8;
  TPZFNMatrix<6,_double>::TPZFNMatrix(in_RCX,in_R8);
  return;
}

Assistant:

TPZGeoElMapped<TBase>::TPZGeoElMapped(TPZGeoMesh &destmesh, const TPZGeoElMapped<TBase> &copy, std::map<int64_t,int64_t> &gl2lcNdIdx,
                                      std::map<int64_t,int64_t> &gl2lcElIdx) : 
TPZRegisterClassId(&TPZGeoElMapped::ClassId),TBase(destmesh,copy,gl2lcNdIdx,gl2lcElIdx),
    fCornerCo(copy.fCornerCo)
{
    
}